

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# between_expression.cpp
# Opt level: O2

bool duckdb::BetweenExpression::Equal(BetweenExpression *a,BetweenExpression *b)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar1;
  pointer pPVar2;
  type pPVar3;
  undefined8 extraout_RDX;
  
  pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&a->input);
  pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator*(&b->input);
  iVar1 = (*(pPVar2->super_BaseExpression)._vptr_BaseExpression[10])(pPVar2,pPVar3);
  if ((char)iVar1 != '\0') {
    pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&a->lower);
    pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator*(&b->lower);
    iVar1 = (*(pPVar2->super_BaseExpression)._vptr_BaseExpression[10])(pPVar2,pPVar3);
    if ((char)iVar1 != '\0') {
      pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(&a->upper);
      pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator*(&b->upper);
      UNRECOVERED_JUMPTABLE = (pPVar2->super_BaseExpression)._vptr_BaseExpression[10];
      iVar1 = (*UNRECOVERED_JUMPTABLE)(pPVar2,pPVar3,extraout_RDX,UNRECOVERED_JUMPTABLE);
      return SUB41(iVar1,0);
    }
  }
  return false;
}

Assistant:

bool BetweenExpression::Equal(const BetweenExpression &a, const BetweenExpression &b) {
	if (!a.input->Equals(*b.input)) {
		return false;
	}
	if (!a.lower->Equals(*b.lower)) {
		return false;
	}
	if (!a.upper->Equals(*b.upper)) {
		return false;
	}
	return true;
}